

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  GLFWmonitor *pGVar1;
  GLFWvidmode *pGVar2;
  int ypos;
  int xpos;
  int width;
  int height;
  int refreshRate;
  
  if (action == 1) {
    if (key == 0x100 && mods == 0) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
    if ((key == 300 || key == 0x101) && mods == 4) {
      pGVar1 = glfwGetWindowMonitor(window);
      if (pGVar1 == (GLFWmonitor *)0x0) {
        pGVar1 = glfwGetPrimaryMonitor();
        if (pGVar1 == (GLFWmonitor *)0x0) {
          return;
        }
        pGVar2 = glfwGetVideoMode(pGVar1);
        glfwGetWindowPos(window,&windowed_xpos,&windowed_ypos);
        glfwGetWindowSize(window,&windowed_width,&windowed_height);
        width = pGVar2->width;
        height = pGVar2->height;
        refreshRate = pGVar2->refreshRate;
        xpos = 0;
        ypos = 0;
      }
      else {
        refreshRate = 0;
        pGVar1 = (GLFWmonitor *)0x0;
        xpos = windowed_xpos;
        ypos = windowed_ypos;
        width = windowed_width;
        height = windowed_height;
      }
      glfwSetWindowMonitor(window,pGVar1,xpos,ypos,width,height,refreshRate);
    }
  }
  return;
}

Assistant:

void key_callback( GLFWwindow* window, int key, int scancode, int action, int mods )
{
    if (action != GLFW_PRESS)
        return;

    if (key == GLFW_KEY_ESCAPE && mods == 0)
        glfwSetWindowShouldClose(window, GLFW_TRUE);
    if ((key == GLFW_KEY_ENTER && mods == GLFW_MOD_ALT) ||
        (key == GLFW_KEY_F11 && mods == GLFW_MOD_ALT))
    {
        if (glfwGetWindowMonitor(window))
        {
            glfwSetWindowMonitor(window, NULL,
                                 windowed_xpos, windowed_ypos,
                                 windowed_width, windowed_height, 0);
        }
        else
        {
            GLFWmonitor* monitor = glfwGetPrimaryMonitor();
            if (monitor)
            {
                const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                glfwGetWindowPos(window, &windowed_xpos, &windowed_ypos);
                glfwGetWindowSize(window, &windowed_width, &windowed_height);
                glfwSetWindowMonitor(window, monitor, 0, 0, mode->width, mode->height, mode->refreshRate);
            }
        }
    }
}